

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.h
# Opt level: O0

char * __thiscall
btConeTwistConstraint::serialize
          (btConeTwistConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btTransform *in_RSI;
  btTransformFloatData *in_RDI;
  btSerializer *unaff_retaddr;
  btConeTwistConstraintData *cone;
  
  btTypedConstraint::serialize((btTypedConstraint *)serializer,cone,unaff_retaddr);
  btTransform::serialize(in_RSI,in_RDI);
  btTransform::serialize(in_RSI,in_RDI);
  in_RSI[3].m_basis.m_el[0].m_floats[0] = in_RDI[7].m_basis.m_el[1].m_floats[1];
  in_RSI[3].m_basis.m_el[0].m_floats[1] = in_RDI[7].m_basis.m_el[1].m_floats[2];
  in_RSI[3].m_basis.m_el[0].m_floats[2] = in_RDI[7].m_basis.m_el[1].m_floats[3];
  in_RSI[3].m_basis.m_el[0].m_floats[3] = in_RDI[7].m_basis.m_el[0].m_floats[1];
  in_RSI[3].m_basis.m_el[1].m_floats[0] = in_RDI[7].m_basis.m_el[0].m_floats[2];
  in_RSI[3].m_basis.m_el[1].m_floats[1] = in_RDI[7].m_basis.m_el[0].m_floats[3];
  in_RSI[3].m_basis.m_el[1].m_floats[2] = in_RDI[7].m_basis.m_el[1].m_floats[0];
  return "btConeTwistConstraintData";
}

Assistant:

SIMD_FORCE_INLINE const char*	btConeTwistConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btConeTwistConstraintData2* cone = (btConeTwistConstraintData2*) dataBuffer;
	btTypedConstraint::serialize(&cone->m_typeConstraintData,serializer);

	m_rbAFrame.serialize(cone->m_rbAFrame);
	m_rbBFrame.serialize(cone->m_rbBFrame);
	
	cone->m_swingSpan1 = m_swingSpan1;
	cone->m_swingSpan2 = m_swingSpan2;
	cone->m_twistSpan = m_twistSpan;
	cone->m_limitSoftness = m_limitSoftness;
	cone->m_biasFactor = m_biasFactor;
	cone->m_relaxationFactor = m_relaxationFactor;
	cone->m_damping = m_damping;

	return btConeTwistConstraintDataName;
}